

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::save_to_file(CVmObjDict *this,CVmFile *fp)

{
  _func_void_void_ptr_CVmHashEntry_ptr *func;
  CVmHashTable *in_RSI;
  CVmFile *in_RDI;
  save_file_ctx ctx;
  long end_pos;
  long cnt_pos;
  void *in_stack_ffffffffffffffe0;
  CVmHashTable *this_00;
  
  this_00 = in_RSI;
  get_ext((CVmObjDict *)in_RDI);
  CVmFile::write_uint4(in_RDI,(uint)((ulong)in_RSI >> 0x20));
  func = (_func_void_void_ptr_CVmHashEntry_ptr *)CVmFile::get_pos(in_RDI);
  CVmFile::write_uint4(in_RDI,(uint)((ulong)in_RSI >> 0x20));
  get_ext((CVmObjDict *)in_RDI);
  CVmHashTable::enum_entries(this_00,func,in_stack_ffffffffffffffe0);
  CVmFile::get_pos(in_RDI);
  CVmFile::set_pos(in_RDI,(long)in_RSI);
  CVmFile::write_uint4(in_RDI,(uint)((ulong)in_RSI >> 0x20));
  CVmFile::set_pos(in_RDI,(long)in_RSI);
  return;
}

Assistant:

void CVmObjDict::save_to_file(VMG_ CVmFile *fp)
{
    long cnt_pos;
    long end_pos;
    save_file_ctx ctx;

    /* write the current comparator object */
    fp->write_uint4(get_ext()->comparator_);
    
    /* remember the starting seek position and write a placeholder count */
    cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate the entries to write out each one */
    ctx.fp = fp;
    ctx.cnt = 0;
    ctx.vmg = VMGLOB_ADDR;
    get_ext()->hashtab_->enum_entries(&save_file_cb, &ctx);

    /* remember our position for a moment */
    end_pos = fp->get_pos();

    /* go back and write out the symbol count prefix */
    fp->set_pos(cnt_pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to the end */
    fp->set_pos(end_pos);
}